

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O1

bool jsoncons::jsonpath::operator==(basic_path_node<char> *lhs,basic_path_node<char> *rhs)

{
  path_node_kind pVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  
  if (lhs->size_ == rhs->size_) {
    bVar3 = true;
    do {
      pVar1 = lhs->node_kind_;
      if (pVar1 == rhs->node_kind_) {
        if (pVar1 < index) {
          __n = (lhs->name_)._M_len;
          if (__n != (rhs->name_)._M_len) goto LAB_003e70df;
          if (__n == 0) {
            bVar3 = true;
          }
          else {
            iVar2 = bcmp((lhs->name_)._M_str,(rhs->name_)._M_str,__n);
            bVar3 = iVar2 == 0;
          }
        }
        else if (pVar1 == index) {
          bVar3 = lhs->index_ == rhs->index_;
        }
      }
      else {
LAB_003e70df:
        bVar3 = false;
      }
      lhs = lhs->parent_;
    } while ((lhs != (basic_path_node<char> *)0x0) && (rhs = rhs->parent_, bVar3));
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

std::size_t size() const
        {
            return size_;
        }